

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O3

bool __thiscall slang::parsing::ParserBase::haveDiagAtCurrentLoc(ParserBase *this)

{
  Diagnostics *pDVar1;
  size_type sVar2;
  pointer pDVar3;
  bool bVar4;
  SourceLocation SVar5;
  Token local_28;
  
  pDVar1 = ((this->window).tokenSource)->diagnostics;
  SVar5 = getLastLocation(this);
  sVar2 = (pDVar1->super_SmallVector<slang::Diagnostic,_2UL>).
          super_SmallVectorBase<slang::Diagnostic>.len;
  if ((sVar2 != 0) &&
     (bVar4 = Diagnostic::isError((pDVar1->super_SmallVector<slang::Diagnostic,_2UL>).
                                  super_SmallVectorBase<slang::Diagnostic>.data_ + (sVar2 - 1)),
     bVar4)) {
    sVar2 = (pDVar1->super_SmallVector<slang::Diagnostic,_2UL>).
            super_SmallVectorBase<slang::Diagnostic>.len;
    pDVar3 = (pDVar1->super_SmallVector<slang::Diagnostic,_2UL>).
             super_SmallVectorBase<slang::Diagnostic>.data_;
    if (pDVar3[sVar2 - 1].location == SVar5) {
      return true;
    }
    local_28 = peek(this);
    SVar5 = Token::location(&local_28);
    return pDVar3[sVar2 - 1].location == SVar5;
  }
  return false;
}

Assistant:

bool ParserBase::haveDiagAtCurrentLoc() {
    Diagnostics& diags = getDiagnostics();
    auto location = getLastLocation();
    return !diags.empty() && diags.back().isError() &&
           (diags.back().location == location || diags.back().location == peek().location());
}